

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O2

string * RccGetExecutable(string *__return_storage_ptr__,cmGeneratorTarget *target,
                         string *qtMajorVersion)

{
  bool bVar1;
  cmLocalGenerator *this;
  cmGeneratorTarget *pcVar2;
  string *psVar3;
  allocator local_41;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this = cmGeneratorTarget::GetLocalGenerator(target);
  bVar1 = std::operator==(qtMajorVersion,"5");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_40,"Qt5::rcc",&local_41);
    pcVar2 = cmLocalGenerator::FindGeneratorTargetToUse(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (pcVar2 == (cmGeneratorTarget *)0x0) {
      psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      cmSystemTools::Error
                ("Qt5::rcc target not found ",(psVar3->_M_dataplus)._M_p,(char *)0x0,(char *)0x0);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_40,"",&local_41);
    cmGeneratorTarget::ImportedGetLocation(pcVar2,&local_40);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  else {
    bVar1 = std::operator==(qtMajorVersion,"4");
    if (!bVar1) {
      psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      cmSystemTools::Error
                ("The CMAKE_AUTORCC feature supports only Qt 4 and Qt 5 ",(psVar3->_M_dataplus)._M_p
                 ,(char *)0x0,(char *)0x0);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_40,"Qt4::rcc",&local_41);
    pcVar2 = cmLocalGenerator::FindGeneratorTargetToUse(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (pcVar2 == (cmGeneratorTarget *)0x0) {
      psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      cmSystemTools::Error
                ("Qt4::rcc target not found ",(psVar3->_M_dataplus)._M_p,(char *)0x0,(char *)0x0);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_40,"",&local_41);
    cmGeneratorTarget::ImportedGetLocation(pcVar2,&local_40);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string RccGetExecutable(cmGeneratorTarget const* target,
                                    const std::string& qtMajorVersion)
{
  std::string rccExec;
  cmLocalGenerator* lg = target->GetLocalGenerator();
  if (qtMajorVersion == "5") {
    cmGeneratorTarget* qt5Rcc = lg->FindGeneratorTargetToUse("Qt5::rcc");
    if (qt5Rcc != CM_NULLPTR) {
      rccExec = qt5Rcc->ImportedGetLocation("");
    } else {
      cmSystemTools::Error("Qt5::rcc target not found ",
                           target->GetName().c_str());
    }
  } else if (qtMajorVersion == "4") {
    cmGeneratorTarget* qt4Rcc = lg->FindGeneratorTargetToUse("Qt4::rcc");
    if (qt4Rcc != CM_NULLPTR) {
      rccExec = qt4Rcc->ImportedGetLocation("");
    } else {
      cmSystemTools::Error("Qt4::rcc target not found ",
                           target->GetName().c_str());
    }
  } else {
    cmSystemTools::Error(
      "The CMAKE_AUTORCC feature supports only Qt 4 and Qt 5 ",
      target->GetName().c_str());
  }
  return rccExec;
}